

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::BlenderImporter::CanRead
          (BlenderImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  string local_58;
  string *local_38;
  string *extension;
  IOSystem *pIStack_28;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  BlenderImporter *this_local;
  
  extension._7_1_ = checkSig;
  pIStack_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)pFile;
  pFile_local = (string *)this;
  BaseImporter::GetExtension(&local_58,pFile);
  local_38 = &local_58;
  bVar1 = std::operator==(&local_58,"blend");
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    lVar2 = std::__cxx11::string::length();
    if (((lVar2 == 0) || ((extension._7_1_ & 1) != 0)) && (pIStack_28 != (IOSystem *)0x0)) {
      this_local._7_1_ =
           BaseImporter::SearchFileHeaderForToken
                     (pIStack_28,(string *)pIOHandler_local,TokensForSearch,1,200,false,false);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  std::__cxx11::string::~string((string *)&local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BlenderImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == "blend") {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        // note: this won't catch compressed files
        return SearchFileHeaderForToken(pIOHandler,pFile, TokensForSearch,1);
    }
    return false;
}